

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O2

int __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowOrderNo(TcLicenseOnlineInfo *this,ostream *os,AdsDevice *device)

{
  long lVar1;
  ostream *poVar2;
  uint uVar3;
  uint32_t bytesRead;
  vector<char,_std::allocator<char>_> readBuffer;
  string local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  bytesRead = 0;
  std::vector<char,_std::allocator<char>_>::vector(&readBuffer,0x10,(allocator_type *)&stream);
  lVar1 = AdsDevice::ReadWriteReqEx2
                    (device,0x101000d,0,
                     (long)readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                     (long)readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                     readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0x10,this,&bytesRead);
  if (lVar1 == 0) {
    if (bytesRead < 2) {
      std::operator<<(os,"N/A");
    }
    else {
      readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] = '\0';
      std::operator<<(os,readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
    }
    uVar3 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar2 = std::operator<<(local_1a8,"ShowOrderNo");
    poVar2 = std::operator<<(poVar2,"(): failed with: 0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,'\n');
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    uVar3 = 1;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<char,_std::allocator<char>_>);
  return uVar3;
}

Assistant:

int ShowOrderNo(std::ostream& os, const AdsDevice& device) const
    {
        uint32_t bytesRead = 0;
        auto readBuffer = std::vector<char>(16);
        const auto status = device.ReadWriteReqEx2(0x0101000D,
                                                   0x0,
                                                   readBuffer.capacity(),
                                                   readBuffer.data(),
                                                   sizeof(licenseId),
                                                   &licenseId,
                                                   &bytesRead);
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }

        if (1 < bytesRead) {
            // Ensure the order number is NULL terminated.
            readBuffer.back() = '\0';
            os << readBuffer.data();
        } else {
            os << "N/A";
        }
        return !os.good();
    }